

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

void * __thiscall
DeviceTy::getOrAllocTgtPtr
          (DeviceTy *this,void *HstPtrBegin,void *HstPtrBase,int64_t Size,bool *IsNew,
          bool IsImplicit,bool UpdateRefCount)

{
  reference pHVar1;
  value_type *in_RCX;
  list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *in_RDX;
  uintptr_t in_RSI;
  long in_RDI;
  undefined1 *in_R8;
  byte in_R9B;
  LookupResult LVar2;
  byte in_stack_00000008;
  uintptr_t tp_1;
  uintptr_t tp;
  HostDataToTargetTy *HT;
  LookupResult lr;
  void *rc;
  mutex *in_stack_ffffffffffffff50;
  value_type *__x;
  list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *this_00;
  uintptr_t in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  DeviceTy *in_stack_ffffffffffffff90;
  byte local_48;
  void *local_38;
  
  local_38 = (void *)0x0;
  __x = in_RCX;
  this_00 = in_RDX;
  std::mutex::lock(in_stack_ffffffffffffff50);
  LVar2 = lookupMapping(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                        in_stack_ffffffffffffff80);
  local_48 = LVar2.Flags._0_1_;
  if ((((undefined1  [16])LVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
     ((((local_48 >> 1 & 1) == 0 && ((local_48 >> 2 & 1) == 0)) || ((in_R9B & 1) == 0)))) {
    if (((((local_48 >> 1 & 1) == 0) && ((local_48 >> 2 & 1) == 0)) || ((in_R9B & 1) != 0)) &&
       (in_RCX != (value_type *)0x0)) {
      *in_R8 = 1;
      local_38 = (void *)(**(code **)(*(long *)(in_RDI + 8) + 0x30))
                                   (*(undefined4 *)(in_RDI + 0x10),in_RCX,in_RSI);
      HostDataToTargetTy::HostDataToTargetTy
                ((HostDataToTargetTy *)&stack0xffffffffffffff78,(uintptr_t)in_RDX,in_RSI,
                 (long)&in_RCX->HstPtrBase + in_RSI,(uintptr_t)local_38);
      std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::push_front
                (this_00,__x);
    }
  }
  else {
    pHVar1 = std::_List_iterator<HostDataToTargetTy>::operator*
                       ((_List_iterator<HostDataToTargetTy> *)0x103635);
    *in_R8 = 0;
    if ((in_stack_00000008 & 1) != 0) {
      pHVar1->RefCount = pHVar1->RefCount + 1;
    }
    local_38 = (void *)(pHVar1->TgtPtrBegin + (in_RSI - pHVar1->HstPtrBegin));
  }
  std::mutex::unlock((mutex *)0x103776);
  return local_38;
}

Assistant:

void *DeviceTy::getOrAllocTgtPtr(void *HstPtrBegin, void *HstPtrBase,
    int64_t Size, bool &IsNew, bool IsImplicit, bool UpdateRefCount) {
  void *rc = NULL;
  DataMapMtx.lock();
  LookupResult lr = lookupMapping(HstPtrBegin, Size);

  // Check if the pointer is contained.
  if (lr.Flags.IsContained ||
      ((lr.Flags.ExtendsBefore || lr.Flags.ExtendsAfter) && IsImplicit)) {
    auto &HT = *lr.Entry;
    IsNew = false;

    if (UpdateRefCount)
      ++HT.RefCount;

    uintptr_t tp = HT.TgtPtrBegin + ((uintptr_t)HstPtrBegin - HT.HstPtrBegin);
    DP("Mapping exists%s with HstPtrBegin=" DPxMOD ", TgtPtrBegin=" DPxMOD ", "
        "Size=%ld,%s RefCount=%s\n", (IsImplicit ? " (implicit)" : ""),
        DPxPTR(HstPtrBegin), DPxPTR(tp), Size,
        (UpdateRefCount ? " updated" : ""),
        (CONSIDERED_INF(HT.RefCount)) ? "INF" :
            std::to_string(HT.RefCount).c_str());
    rc = (void *)tp;
  } else if ((lr.Flags.ExtendsBefore || lr.Flags.ExtendsAfter) && !IsImplicit) {
    // Explicit extension of mapped data - not allowed.
    DP("Explicit extension of mapping is not allowed.\n");
  } else if (Size) {
    // If it is not contained and Size > 0 we should create a new entry for it.
    IsNew = true;
    uintptr_t tp = (uintptr_t)RTL->data_alloc(RTLDeviceID, Size, HstPtrBegin);
    DP("Creating new map entry: HstBase=" DPxMOD ", HstBegin=" DPxMOD ", "
        "HstEnd=" DPxMOD ", TgtBegin=" DPxMOD "\n", DPxPTR(HstPtrBase),
        DPxPTR(HstPtrBegin), DPxPTR((uintptr_t)HstPtrBegin + Size), DPxPTR(tp));
    HostDataToTargetMap.push_front(HostDataToTargetTy((uintptr_t)HstPtrBase,
        (uintptr_t)HstPtrBegin, (uintptr_t)HstPtrBegin + Size, tp));
    rc = (void *)tp;
  }

  DataMapMtx.unlock();
  return rc;
}